

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\nC++17 introduced Hexadecimal Floating Point Literals ");
  poVar1 = std::operator<<(poVar1,"in three different formats.\n\n");
  poVar1 = std::operator<<(poVar1,"\"0x|0x hex-digit-seq\":\t\t\t\t");
  std::operator<<(poVar1,"0x1ffp96:\t\t");
  poVar1 = std::ostream::_M_insert<double>(4.0485591044789077e+31);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"\"0x|0x hex-digit-seq . \":\t\t\t");
  std::operator<<(poVar1,"0xa.p-2:\t\t");
  poVar1 = std::ostream::_M_insert<double>(2.5);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"\"0x|0X hex-digit-seq . hex-digit-seq\":\t\t");
  std::operator<<(poVar1,"0x1.743p-3:\t\t");
  poVar1 = std::ostream::_M_insert<double>(0.181732177734375);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,'\n');
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
	std::cout << "\nC++17 introduced Hexadecimal Floating Point Literals "
			<<"in three different formats.\n\n" 
			<<"\"0x|0x hex-digit-seq\":\t\t\t\t" << "0x1ffp96:\t\t" << 0x1ffp96 << '\n'
			<<"\"0x|0x hex-digit-seq . \":\t\t\t" << "0xa.p-2:\t\t" << 0xa.p-2 << '\n'
			<<"\"0x|0X hex-digit-seq . hex-digit-seq\":\t\t" << "0x1.743p-3:\t\t" << 0x1.743p-3 << '\n'
		<< '\n' << std::endl;
}